

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O0

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::SetInitialDualValue
          (BasicProblem<mp::BasicProblemParams<int>_> *this,int con_index,double value)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  uint in_ESI;
  vector<double,_std::allocator<double>_> *in_RDI;
  value_type in_XMM0_Qa;
  size_type in_stack_ffffffffffffffd8;
  pointer *__new_size;
  undefined4 in_stack_fffffffffffffff0;
  
  sVar1 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)
                     &in_RDI[0x21].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (sVar1 <= in_ESI) {
    std::
    vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
    ::capacity((vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                *)(in_RDI + 0x17));
    std::vector<double,_std::allocator<double>_>::reserve
              ((vector<double,_std::allocator<double>_> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0)
               ,(size_type)in_XMM0_Qa);
    num_algebraic_cons((BasicProblem<mp::BasicProblemParams<int>_> *)0x4bf10a);
    std::vector<double,_std::allocator<double>_>::resize(in_RDI,in_stack_ffffffffffffffd8);
    std::
    vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
    ::capacity((vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                *)(in_RDI + 0x17));
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
               (size_type)in_XMM0_Qa);
    __new_size = &in_RDI[0x22].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    num_algebraic_cons((BasicProblem<mp::BasicProblemParams<int>_> *)0x4bf15b);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_RDI,(size_type)__new_size);
  }
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)
                      &in_RDI[0x21].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(long)(int)in_ESI);
  *pvVar2 = in_XMM0_Qa;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)
                      &in_RDI[0x22].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(long)(int)in_ESI);
  *pvVar3 = 1;
  return;
}

Assistant:

void SetInitialDualValue(int con_index, double value) {
    MP_ASSERT(0 <= con_index && con_index < num_algebraic_cons(),
              "invalid index");
    if (initial_dual_values_.size() <= static_cast<unsigned>(con_index)) {
      initial_dual_values_.reserve(algebraic_cons_.capacity());
      initial_dual_values_.resize(num_algebraic_cons());
      idv_set_.reserve(algebraic_cons_.capacity());
      idv_set_.resize(num_algebraic_cons());
    }
    initial_dual_values_[con_index] = value;
    idv_set_[con_index] = 1;
  }